

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCompare.c
# Opt level: O0

int Mvc_CubeCompareSizeAndInt(Mvc_Cube_t *pC1,Mvc_Cube_t *pC2,Mvc_Cube_t *pMask)

{
  uint local_2c;
  int i;
  Mvc_Cube_t *pMask_local;
  Mvc_Cube_t *pC2_local;
  Mvc_Cube_t *pC1_local;
  
  if (pC1->nOnes < pC2->nOnes) {
    pC1_local._4_4_ = 1;
  }
  else if (pC2->nOnes < pC1->nOnes) {
    pC1_local._4_4_ = -1;
  }
  else if ((*(uint *)&pC1->field_0x8 & 0xffffff) == 0) {
    if (pC1->pData[0] < pC2->pData[0]) {
      pC1_local._4_4_ = -1;
    }
    else if (pC2->pData[0] < pC1->pData[0]) {
      pC1_local._4_4_ = 1;
    }
    else {
      pC1_local._4_4_ = 0;
    }
  }
  else if ((*(uint *)&pC1->field_0x8 & 0xffffff) == 1) {
    if (*(uint *)&pC1->field_0x14 < *(uint *)&pC2->field_0x14) {
      pC1_local._4_4_ = -1;
    }
    else if (*(uint *)&pC2->field_0x14 < *(uint *)&pC1->field_0x14) {
      pC1_local._4_4_ = 1;
    }
    else if (pC1->pData[0] < pC2->pData[0]) {
      pC1_local._4_4_ = -1;
    }
    else if (pC2->pData[0] < pC1->pData[0]) {
      pC1_local._4_4_ = 1;
    }
    else {
      pC1_local._4_4_ = 0;
    }
  }
  else {
    for (local_2c = *(uint *)&pC1->field_0x8 & 0xffffff; -1 < (int)local_2c; local_2c = local_2c - 1
        ) {
      if (pC1->pData[(int)local_2c] < pC2->pData[(int)local_2c]) {
        return -1;
      }
      if (pC2->pData[(int)local_2c] < pC1->pData[(int)local_2c]) {
        return 1;
      }
    }
    pC1_local._4_4_ = 0;
  }
  return pC1_local._4_4_;
}

Assistant:

int Mvc_CubeCompareSizeAndInt( Mvc_Cube_t * pC1, Mvc_Cube_t * pC2, Mvc_Cube_t * pMask )
{
    // compare the cubes by size
    if ( Mvc_CubeReadSize( pC1 ) < Mvc_CubeReadSize( pC2 ) )
        return 1;
    if ( Mvc_CubeReadSize( pC1 ) > Mvc_CubeReadSize( pC2 ) )
        return -1;
    // the cubes have the same size

    // compare the cubes as integers
    if ( Mvc_Cube1Words( pC1 ) )
    {
        if ( pC1->pData[0] < pC2->pData[0] )
            return -1;
        if ( pC1->pData[0] > pC2->pData[0] )
            return 1;
        return 0;
    }
    else if ( Mvc_Cube2Words( pC1 ) )
    {
        if ( pC1->pData[1] < pC2->pData[1] )
            return -1;
        if ( pC1->pData[1] > pC2->pData[1] )
            return 1;
        if ( pC1->pData[0] < pC2->pData[0] )
            return -1;
        if ( pC1->pData[0] > pC2->pData[0] )
            return 1;
        return 0;
    }
    else                            
    {
        int i = Mvc_CubeReadLast( pC1 );
        for(; i >= 0; i--)
        {
            if ( pC1->pData[i] < pC2->pData[i] )
                return -1;
            if ( pC1->pData[i] > pC2->pData[i] )
                return 1;
        }
        return 0;
    }
}